

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC16.cpp
# Opt level: O0

void CRC16::init_crc_table(void)

{
  reference pvVar1;
  ushort uVar2;
  int local_10;
  ushort local_c;
  ushort local_a;
  int j;
  uint16_t crc;
  uint16_t i;
  
  pvVar1 = std::array<unsigned_short,_256UL>::operator[](&s_crc_lookup,0);
  if (*pvVar1 == 0) {
    for (local_a = 0; local_a < 0x100; local_a = local_a + 1) {
      local_c = local_a << 8;
      for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
        uVar2 = 0;
        if ((local_c & 0x8000) != 0) {
          uVar2 = 0x1021;
        }
        local_c = local_c << 1 ^ uVar2;
      }
      pvVar1 = std::array<unsigned_short,_256UL>::operator[](&s_crc_lookup,(ulong)local_a);
      *pvVar1 = local_c;
    }
  }
  return;
}

Assistant:

void CRC16::init_crc_table()
{
    if (!s_crc_lookup[0])
    {
        for (uint16_t i = 0; i < 256; ++i)
        {
            uint16_t crc = i << 8;

            for (int j = 0; j < 8; ++j)
                crc = (crc << 1) ^ ((crc & 0x8000) ? POLYNOMIAL : 0);

            s_crc_lookup[i] = crc;
        }
    }
}